

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

void remove_expired(CookieInfo *cookies)

{
  Cookie *pCVar1;
  time_t tVar2;
  Cookie *pCVar3;
  Cookie *pCVar4;
  Cookie *co;
  
  tVar2 = time((time_t *)0x0);
  if (cookies->cookies != (Cookie *)0x0) {
    pCVar4 = (Cookie *)0x0;
    co = cookies->cookies;
    do {
      pCVar1 = co->next;
      if ((co->expires != 0) && (co->expires < tVar2)) {
        pCVar3 = pCVar4;
        if (co == cookies->cookies) {
          pCVar3 = (Cookie *)cookies;
        }
        pCVar3->next = pCVar1;
        cookies->numcookies = cookies->numcookies + -1;
        freecookie(co);
        co = pCVar4;
      }
      pCVar4 = co;
      co = pCVar1;
    } while (pCVar1 != (Cookie *)0x0);
  }
  return;
}

Assistant:

static void remove_expired(struct CookieInfo *cookies)
{
  struct Cookie *co, *nx, *pv;
  curl_off_t now = (curl_off_t)time(NULL);

  co = cookies->cookies;
  pv = NULL;
  while(co) {
    nx = co->next;
    if(co->expires && co->expires < now) {
      if(co == cookies->cookies) {
        cookies->cookies = co->next;
      }
      else {
        pv->next = co->next;
      }
      cookies->numcookies--;
      freecookie(co);
    }
    else {
      pv = co;
    }
    co = nx;
  }
}